

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O2

void SendPeerSetupMsg(WS_ReaderInfo reader,int reversePeer,int myRank)

{
  SstStream s;
  int iVar1;
  void *local_20;
  int local_18;
  int local_14;
  
  s = reader->ParentStream;
  local_20 = reader->Connections[reversePeer].RemoteStreamID;
  local_14 = s->CohortSize;
  local_18 = myRank;
  iVar1 = CMwrite(reader->Connections[reversePeer].CMconn,s->CPInfo->SharedCM->PeerSetupFormat,
                  &local_20);
  if (iVar1 != 1) {
    CP_verbose(s,CriticalVerbose,
               "Message failed to send to reader peer rank %d in sendPeerSetup in reader open\n",
               reversePeer);
  }
  return;
}

Assistant:

static void SendPeerSetupMsg(WS_ReaderInfo reader, int reversePeer, int myRank)
{
    CMConnection conn = reader->Connections[reversePeer].CMconn;
    SstStream Stream = reader->ParentStream;
    struct _PeerSetupMsg setup;
    memset(&setup, 0, sizeof(setup));
    setup.RS_Stream = reader->Connections[reversePeer].RemoteStreamID;
    setup.WriterRank = myRank;
    setup.WriterCohortSize = Stream->CohortSize;
    STREAM_ASSERT_UNLOCKED(Stream);
    if (CMwrite(conn, Stream->CPInfo->SharedCM->PeerSetupFormat, &setup) != 1)
    {
        CP_verbose(Stream, CriticalVerbose,
                   "Message failed to send to reader peer rank %d in sendPeerSetup in "
                   "reader open\n",
                   reversePeer);
    }
}